

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

int __thiscall PixelToaster::UnixDisplay::open(UnixDisplay *this,char *__file,int __oflag,...)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Display *pDVar4;
  Converter *pCVar5;
  Window WVar6;
  Atom AVar7;
  XImage *pXVar8;
  Listener *pLVar9;
  undefined4 extraout_var;
  uint in_ECX;
  uint in_R8D;
  uint in_R9D;
  UnixDisplay *local_170;
  int local_15c;
  undefined8 local_150;
  XSizeHints sizeHints;
  XSetWindowAttributes attributes;
  int top;
  int left;
  int screenHeight;
  int screenWidth;
  Window root;
  Format local_70;
  Enumeration local_6c;
  Format local_68;
  Enumeration local_64;
  int local_60;
  int local_5c;
  int bitsPerPixel;
  int bytesPerPixel;
  int bufferDepth;
  int displayDepth;
  Visual *visual;
  uint local_40;
  int screen;
  uint local_38;
  int local_34;
  int height_local;
  int width_local;
  char *title_local;
  UnixDisplay *this_local;
  uint local_18;
  Mode mode_local;
  Output output_local;
  
  local_40 = in_R9D;
  screen = in_R8D;
  local_38 = in_ECX;
  local_34 = __oflag;
  _height_local = __file;
  title_local = (char *)this;
  this_local._4_4_ = in_R9D;
  local_18 = in_R8D;
  DisplayAdapter::open
            (&this->super_DisplayAdapter,__file,__oflag,(ulong)in_ECX,(ulong)in_R8D,(ulong)in_R9D);
  pDVar4 = (Display *)XOpenDisplay(0);
  this->display_ = pDVar4;
  if (this->display_ == (Display *)0x0) {
    uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])();
    pLVar9 = (Listener *)(ulong)uVar2;
    mode_local.enumeration._3_1_ = TrueColor >> 0x18;
  }
  else {
    visual._4_4_ = *(int *)(this->display_ + 0xe0);
    _bufferDepth = *(long *)(*(long *)(this->display_ + 0xe8) + (long)visual._4_4_ * 0x80 + 0x40);
    if (_bufferDepth == 0) {
      uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])();
      pLVar9 = (Listener *)(ulong)uVar2;
      mode_local.enumeration._3_1_ = TrueColor >> 0x18;
    }
    else {
      bytesPerPixel = *(int *)(*(long *)(this->display_ + 0xe8) + (long)visual._4_4_ * 0x80 + 0x38);
      local_15c = bytesPerPixel;
      if (bytesPerPixel == 0x18) {
        local_15c = 0x20;
      }
      bitsPerPixel = local_15c;
      local_5c = (local_15c + 7) / 8;
      local_60 = local_5c << 3;
      if ((local_60 == 0x10) || (local_60 == 0x20)) {
        local_64 = (Enumeration)
                   findFormat(local_15c,*(unsigned_long *)(_bufferDepth + 0x18),
                              *(unsigned_long *)(_bufferDepth + 0x20),
                              *(unsigned_long *)(_bufferDepth + 0x28));
        (this->destFormat_).enumeration = local_64;
        Format::Format(&local_68,XBGRFFFF);
        local_6c = (this->destFormat_).enumeration;
        pCVar5 = requestConverter(local_68,(Format)local_6c);
        this->floatingPointConverter_ = pCVar5;
        Format::Format(&local_70,XRGB8888);
        pCVar5 = requestConverter(local_70,(Format)(this->destFormat_).enumeration);
        this->trueColorConverter_ = pCVar5;
        if ((this->floatingPointConverter_ == (Converter *)0x0) ||
           (this->trueColorConverter_ == (Converter *)0x0)) {
          uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])()
          ;
          pLVar9 = (Listener *)(ulong)uVar2;
          mode_local.enumeration._3_1_ = TrueColor >> 0x18;
        }
        else {
          WVar6 = XCreateWindow(this->display_,
                                *(undefined8 *)
                                 (*(long *)(this->display_ + 0xe8) +
                                  (long)*(int *)(this->display_ + 0xe0) * 0x80 + 0x10),
                                (*(int *)(*(long *)(this->display_ + 0xe8) +
                                          (long)visual._4_4_ * 0x80 + 0x18) - local_34) / 2,
                                (int)(*(int *)(*(long *)(this->display_ + 0xe8) +
                                               (long)visual._4_4_ * 0x80 + 0x1c) - local_38) / 2,
                                local_34,local_38,0,bytesPerPixel,1,_bufferDepth,0x4a,
                                &sizeHints.win_gravity);
          this->window_ = WVar6;
          XStoreName(this->display_,this->window_,_height_local);
          AVar7 = XInternAtom(this->display_,"WM_PROTOCOLS",1);
          this->wmProtocols_ = AVar7;
          AVar7 = XInternAtom(this->display_,"WM_DELETE_WINDOW",1);
          this->wmDeleteWindow_ = AVar7;
          if ((this->wmProtocols_ == 0) || (this->wmDeleteWindow_ == 0)) {
            uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])
                              ();
            pLVar9 = (Listener *)(ulong)uVar2;
            mode_local.enumeration._3_1_ = TrueColor >> 0x18;
          }
          else {
            iVar3 = XSetWMProtocols(this->display_,this->window_,&this->wmDeleteWindow_,1);
            if (iVar3 == 0) {
              uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                        [3])();
              pLVar9 = (Listener *)(ulong)uVar2;
              mode_local.enumeration._3_1_ = TrueColor >> 0x18;
            }
            else {
              local_150 = 0x34;
              sizeHints.flags._4_4_ = 0;
              sizeHints.flags._0_4_ = 0;
              sizeHints.min_width = local_34;
              sizeHints.width = local_34;
              sizeHints.min_height = local_38;
              sizeHints.height = local_38;
              XSetNormalHints(this->display_,this->window_,&local_150);
              XClearWindow(this->display_,this->window_);
              XSelectInput(this->display_,this->window_,0x204f);
              DirtyVector<char>::reset(&this->buffer_,(long)(int)(local_34 * local_38 * local_5c));
              bVar1 = DirtyVector<char>::isEmpty(&this->buffer_);
              if (bVar1) {
                uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                          [3])();
                pLVar9 = (Listener *)(ulong)uVar2;
                mode_local.enumeration._3_1_ = TrueColor >> 0x18;
              }
              else {
                this->gc_ = *(GC *)(*(long *)(this->display_ + 0xe8) + (long)visual._4_4_ * 0x80 +
                                   0x48);
                pXVar8 = (XImage *)
                         XCreateImage(this->display_,0,bytesPerPixel,2,0,0,local_34,local_38,
                                      local_60,local_34 * local_5c);
                this->image_ = pXVar8;
                this->image_->byte_order = 0;
                if (this->image_ == (XImage *)0x0) {
                  uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface.
                            _vptr_DisplayInterface[3])();
                  pLVar9 = (Listener *)(ulong)uVar2;
                  mode_local.enumeration._3_1_ = TrueColor >> 0x18;
                }
                else {
                  XMapRaised(this->display_,this->window_);
                  XFlush(this->display_);
                  pLVar9 = DisplayAdapter::listener(&this->super_DisplayAdapter);
                  if (pLVar9 != (Listener *)0x0) {
                    pLVar9 = DisplayAdapter::listener(&this->super_DisplayAdapter);
                    iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface.
                              _vptr_DisplayInterface[0x10])();
                    local_170 = this;
                    if (CONCAT44(extraout_var,iVar3) != 0) {
                      uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface.
                                _vptr_DisplayInterface[0x10])();
                      local_170 = (UnixDisplay *)(ulong)uVar2;
                    }
                    pLVar9 = (Listener *)(**(code **)(*(long *)pLVar9 + 0x50))(pLVar9,local_170);
                  }
                  mode_local.enumeration._3_1_ = 1;
                }
              }
            }
          }
        }
      }
      else {
        uVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])();
        pLVar9 = (Listener *)(ulong)uVar2;
        mode_local.enumeration._3_1_ = TrueColor >> 0x18;
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)pLVar9 >> 8),mode_local.enumeration._3_1_);
}

Assistant:

bool open(const char title[], int width, int height, Output output, Mode mode) override
    {
        DisplayAdapter::open(title, width, height, output, mode);

        // let's open a display

        display_ = ::XOpenDisplay(0);
        if (!display_)
        {
            close();
            return false;
        }

        const int screen = DefaultScreen(display_);
        ::Visual* visual = DefaultVisual(display_, screen);
        if (!visual)
        {
            close();
            return false;
        }

        // It gets messy when talking about color depths.
        //
        // For the image buffer, we either need 8, 16 or 32 bitsPerPixel.  8 bits we'll
        // never have (hopefully), 16 bits will be used for displayDepth 15 & 16, and
        // 32 bits must be used for depths 24 and 32.
        //
        // The converters will get this right when talking about displayDepth 15 & 16, but
        // it will wrongly assume that displayDepth 24 takes _exactly_ 24 bitsPerPixel.  We
        // solve that by tricking the converter requester by presenting it a 32 bit
        // bufferDepth instead.
        //
        const int displayDepth  = DefaultDepth(display_, screen);
        const int bufferDepth   = displayDepth == 24 ? 32 : displayDepth;
        const int bytesPerPixel = (bufferDepth + 7) / 8;
        const int bitsPerPixel  = 8 * bytesPerPixel;
        if (bitsPerPixel != 16 && bitsPerPixel != 32)
        {
            close();
            return false;
        }

        destFormat_             = findFormat(bufferDepth,
                                 visual->red_mask, visual->green_mask, visual->blue_mask);
        floatingPointConverter_ = requestConverter(Format::XBGRFFFF, destFormat_);
        trueColorConverter_     = requestConverter(Format::XRGB8888, destFormat_);
        if (!floatingPointConverter_ || !trueColorConverter_)
        {
            close();
            return false;
        }

        // let's create a window

        const Window root = DefaultRootWindow(display_);

        const int screenWidth  = DisplayWidth(display_, screen);
        const int screenHeight = DisplayHeight(display_, screen);
        const int left         = (screenWidth - width) / 2;
        const int top          = (screenHeight - height) / 2;

        ::XSetWindowAttributes attributes;
        attributes.border_pixel = attributes.background_pixel = BlackPixel(display_, screen);
        attributes.backing_store                              = NotUseful;

        window_ = ::XCreateWindow(display_, root, left, top, width, height, 0,
                                  displayDepth, InputOutput, visual,
                                  CWBackPixel | CWBorderPixel | CWBackingStore, &attributes);

        ::XStoreName(display_, window_, title);

        wmProtocols_    = XInternAtom(display_, "WM_PROTOCOLS", True);
        wmDeleteWindow_ = XInternAtom(display_, "WM_DELETE_WINDOW", True);
        if (wmProtocols_ == 0 || wmDeleteWindow_ == 0)
        {
            close();
            return false;
        }
        if (::XSetWMProtocols(display_, window_, &wmDeleteWindow_, 1) == 0)
        {
            close();
            return false;
        }

        ::XSizeHints sizeHints;
        sizeHints.flags = PPosition | PMinSize | PMaxSize;
        sizeHints.x = sizeHints.y = 0;
        sizeHints.min_width = sizeHints.max_width = width;
        sizeHints.min_height = sizeHints.max_height = height;
        ::XSetNormalHints(display_, window_, &sizeHints);
        ::XClearWindow(display_, window_);
        ::XSelectInput(display_, window_, eventMask_);

        // create (image) buffer

        buffer_.reset(width * height * bytesPerPixel);
        if (buffer_.isEmpty())
        {
            close();
            return false;
        }

        gc_    = DefaultGC(display_, screen);
        image_ = ::XCreateImage(display_, CopyFromParent, displayDepth, ZPixmap, 0, 0,
                                width, height, bitsPerPixel, width * bytesPerPixel);
#if defined(PIXELTOASTER_LITTLE_ENDIAN)
        image_->byte_order = LSBFirst;
#else
        image_->byte_order = MSBFirst;
#endif
        if (!image_)
        {
            close();
            return false;
        }

        // we have a winner!

        ::XMapRaised(display_, window_);
        ::XFlush(display_);

        if (DisplayAdapter::listener())
            DisplayAdapter::listener()->onOpen(wrapper() ? *wrapper() : *(DisplayInterface*)this);

        return true;
    }